

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O0

void GC::FullGC(void)

{
  if (State < 2) {
    SweepPos = &Root;
    Gray = 0;
    State = 2;
  }
  while (State != 3) {
    SingleStep();
  }
  MarkRoot();
  while (State != 0) {
    SingleStep();
  }
  SetThreshold();
  return;
}

Assistant:

void FullGC()
{
	if (State <= GCS_Propagate)
	{
		// Reset sweep mark to sweep all elements (returning them to white)
		SweepPos = &Root;
		// Reset other collector lists
		Gray = NULL;
		State = GCS_Sweep;
	}
	// Finish any pending sweep phase
	while (State != GCS_Finalize)
	{
		SingleStep();
	}
	MarkRoot();
	while (State != GCS_Pause)
	{
		SingleStep();
	}
	SetThreshold();
}